

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscriber_link.cpp
# Opt level: O2

string * __thiscall miniros::SubscriberLink::getDataType_abi_cxx11_(SubscriberLink *this)

{
  PublicationPtr parent;
  __shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_18,&this->parent_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  return &(local_18._M_ptr)->datatype_;
}

Assistant:

const std::string& SubscriberLink::getDataType()
{
  PublicationPtr parent = parent_.lock();
  return parent->getDataType();
}